

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawstr.c
# Opt level: O2

void Curl_strntoupper(char *dest,char *src,size_t n)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  
  if (n != 0) {
    lVar2 = 0;
    do {
      cVar1 = Curl_raw_toupper(src[lVar2]);
      dest[lVar2] = cVar1;
      if (src[lVar2] == '\0') {
        return;
      }
      bVar3 = n - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void Curl_strntoupper(char *dest, const char *src, size_t n)
{
  if(n < 1)
    return;

  do {
    *dest++ = Curl_raw_toupper(*src);
  } while(*src++ && --n);
}